

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O2

void sh4asm_opcode_non_inst_(uint *quads,sh4asm_disas_emit_func em)

{
  char *__s;
  char buf [64];
  
  __s = buf;
  buf[0x30] = '\0';
  buf[0x31] = '\0';
  buf[0x32] = '\0';
  buf[0x33] = '\0';
  buf[0x34] = '\0';
  buf[0x35] = '\0';
  buf[0x36] = '\0';
  buf[0x37] = '\0';
  buf[0x38] = '\0';
  buf[0x39] = '\0';
  buf[0x3a] = '\0';
  buf[0x3b] = '\0';
  buf[0x3c] = '\0';
  buf[0x3d] = '\0';
  buf[0x3e] = '\0';
  buf[0x3f] = '\0';
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  snprintf(__s,0x40,".byte %x%x\n.byte %x%x\n",(ulong)*quads,(ulong)quads[1],(ulong)quads[2],
           quads[3]);
  buf._56_8_ = buf._56_8_ & 0xffffffffffffff;
  for (; *__s != '\0'; __s = __s + 1) {
    neo_asm_emit(*__s);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_opcode_non_inst_(unsigned const *quads, sh4asm_disas_emit_func em) {
#define NON_INST_BUF_LEN 64
    char buf[NON_INST_BUF_LEN];
    memset(buf, 0, sizeof(buf));
    // TODO: make sure the quads get printed in the right order
    snprintf(buf, NON_INST_BUF_LEN, ".byte %x%x\n.byte %x%x\n",
             quads[0], quads[1], quads[2], quads[3]);
    buf[NON_INST_BUF_LEN - 1] = '\0';
    char const *outp = buf;
    while (*outp)
        em(*outp++);
}